

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void kj::anon_unknown_36::requireValidHeaderValue(StringPtr value)

{
  bool bVar1;
  size_t in_RDX;
  ArrayPtr<const_char> text;
  StringPtr value_00;
  String local_50;
  Fault local_38;
  Fault f;
  bool local_1a;
  DebugExpression<bool> local_19;
  undefined1 auStack_18 [7];
  DebugExpression<bool> _kjCondition;
  StringPtr value_local;
  
  value_00.content.ptr = (char *)value.content.size_;
  f.exception = (Exception *)value.content.ptr;
  value_00.content.size_ = in_RDX;
  _auStack_18 = f.exception;
  local_1a = HttpHeaders::isValidHeaderValue((HttpHeaders *)f.exception,value_00);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (!bVar1) {
    text = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)auStack_18);
    encodeCEscape(&local_50,text);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21],kj::String>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f6,FAILED,"HttpHeaders::isValidHeaderValue(value)",
               "_kjCondition,\"invalid header value\", kj::encodeCEscape(value)",&local_19,
               (char (*) [21])"invalid header value",&local_50);
    String::~String(&local_50);
    kj::_::Debug::Fault::fatal(&local_38);
  }
  return;
}

Assistant:

static void requireValidHeaderValue(kj::StringPtr value) {
  KJ_REQUIRE(HttpHeaders::isValidHeaderValue(value), "invalid header value",
      kj::encodeCEscape(value));
}